

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O1

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::destroyObjects
          (DelayedDestructor<helics::Core> *this,milliseconds delay)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  milliseconds delayTime;
  unique_lock<std::timed_mutex> lock;
  milliseconds minDelay;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  int local_64;
  unique_lock<std::timed_mutex> local_60;
  ulong local_50;
  timespec local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_60._M_owns = false;
  local_38.__r = 200;
  if (200 < delay.__r) {
    local_38.__r = delay.__r;
  }
  local_60._M_device = &this->destructionLock;
  local_50 = delay.__r;
  bVar3 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_60,&local_38);
  sVar7 = 0xffffffffffffffff;
  if (bVar3) {
    local_70.__r = 0x32;
    if ((long)local_50 < 100) {
      local_70.__r = local_50;
    }
    local_64 = 1;
    if (99 < (long)local_50) {
      local_64 = (int)(SUB168(SEXT816((long)local_50) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 5) -
                 (SUB164(SEXT816((long)local_50) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f);
    }
    lVar8 = (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (0 < local_64 && lVar8 != 0) {
      sVar7 = lVar8 >> 4;
      iVar6 = 0;
      do {
        if (iVar6 != 0 && 4 < (long)local_50) {
          std::unique_lock<std::timed_mutex>::unlock(&local_60);
          if (0 < local_70.__r) {
            local_48.tv_sec = (ulong)local_70.__r / 1000;
            local_48.tv_nsec = ((ulong)local_70.__r % 1000) * 1000000;
            do {
              iVar4 = nanosleep(&local_48,&local_48);
              if (iVar4 != -1) break;
              piVar5 = __errno_location();
            } while (*piVar5 == 4);
          }
          bVar3 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                            (&local_60,&local_70);
          if (!bVar3) goto LAB_002e1a9b;
        }
        psVar1 = (this->ElementsToBeDestroyed).
                 super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (this->ElementsToBeDestroyed).
                 super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        sVar7 = (long)psVar2 - (long)psVar1 >> 4;
        if (psVar2 != psVar1) {
          std::unique_lock<std::timed_mutex>::unlock(&local_60);
          destroyObjects(this);
          bVar3 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                            (&local_60,&local_70);
          if (!bVar3) goto LAB_002e1a9b;
        }
      } while ((psVar2 != psVar1) && (iVar6 = iVar6 + 1, iVar6 < local_64));
    }
    sVar7 = (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
  }
LAB_002e1a9b:
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_60);
  return sVar7;
}

Assistant:

size_t destroyObjects(std::chrono::milliseconds delay)
    {
        using namespace std::literals::chrono_literals;
        std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                std::defer_lock);
        auto minDelay = (delay > 200ms) ? delay : 200ms;
        if (!lock.try_lock_for(minDelay)) {
            return static_cast<size_t>(-1);
        }
        auto delayTime = (delay < 100ms) ? delay : 50ms;
        int delayCount =
            (delay < 100ms) ? 1 : static_cast<int>((delay.count() / 50));

        int cnt = 0;
        auto elementSize = ElementsToBeDestroyed.size();
        while (elementSize > 0 && (cnt < delayCount)) {
            if (cnt > 0)  // don't sleep on the first loop
            {
                if (delay > 4ms) {
                    lock.unlock();
                    std::this_thread::sleep_for(delayTime);
                    if (!lock.try_lock_for(delayTime)) {
                        return elementSize;
                    }
                }
            }
            ++cnt;
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                lock.unlock();
                destroyObjects();
                if (!lock.try_lock_for(delayTime)) {
                    return elementSize;
                }
            }
        }
        return ElementsToBeDestroyed.size();
    }